

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O0

void __thiscall DiskTable::persistent(DiskTable *this,MemTable *m,bool df)

{
  bool bVar1;
  pointer plVar2;
  size_type sVar3;
  SSTableData *datas_1;
  SSTableData *datas_2;
  pointer pDVar4;
  SSTableData *pSVar5;
  reference pSVar6;
  size_t sVar7;
  bool local_362;
  bool local_361;
  list<DiskTableNode,_std::allocator<DiskTableNode>_> local_2e8;
  __normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
  local_2d0;
  list<DiskTableNode,_std::allocator<DiskTableNode>_> *local_2c8;
  __normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
  local_2c0 [2];
  _List_node_base *local_2b0;
  _List_node_base *local_2a8;
  list<DiskTableNode,_std::allocator<DiskTableNode>_> *local_2a0;
  path local_298;
  undefined1 local_270 [8];
  DiskTableNode persistent_node;
  ulong local_250;
  size_t blocked_data_bytes;
  SSTableData persistent_data_block;
  iterator overflow_end;
  iterator cur_overflow_entry;
  const_iterator local_218;
  _List_node_base *local_210;
  path local_208;
  SSTableData local_1e0;
  _Self local_1c8;
  _Self local_1c0;
  iterator to_compaction_node;
  path local_190;
  SSTableData local_168;
  _List_node_base *local_150;
  _List_iterator<DiskTableNode> local_148;
  _List_iterator<DiskTableNode> level0_1;
  iterator level0_0;
  undefined1 local_130 [8];
  list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  to_remove_file;
  SSTableData overflow_data;
  int compaction_into_level_limit;
  __normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
  local_f0;
  __normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
  compaction_into_level;
  __normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
  local_c8;
  list<DiskTableNode,_std::allocator<DiskTableNode>_> *local_c0;
  __normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
  local_b8;
  __normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
  local_b0;
  iterator cur_level;
  path local_98;
  anon_class_8_1_8991fb9c local_70;
  anon_class_8_1_8991fb9c writeFileName;
  iterator level0;
  SSTableData local_50;
  undefined1 local_38 [8];
  DiskTableNode new_disk_node;
  bool df_local;
  MemTable *m_local;
  DiskTable *this_local;
  
  new_disk_node.index._7_1_ = df;
  DiskTableNode::DiskTableNode((DiskTableNode *)local_38);
  MemTable::collectData(&local_50,m);
  DiskTableNode::fillData((DiskTableNode *)local_38,&local_50);
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector(&local_50);
  writeFileName.this =
       (DiskTable *)
       std::
       vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
       ::begin(&this->diskView);
  local_70.this = this;
  plVar2 = __gnu_cxx::
           __normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
           ::operator->((__normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
                         *)&writeFileName);
  sVar3 = std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>::size(plVar2);
  if (sVar3 < (ulong)(long)this->LEVEL0_LIMIT) {
    persistent::anon_class_8_1_8991fb9c::operator()
              (&local_98,&local_70,(DiskViewLevelIter)writeFileName.this);
    DiskTableNode::writeToDisk((DiskTableNode *)local_38,&local_98);
    std::filesystem::__cxx11::path::~path(&local_98);
    DiskTableNode::clearDataCache((DiskTableNode *)local_38);
    plVar2 = __gnu_cxx::
             __normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
             ::operator->((__normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
                           *)&writeFileName);
    std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>::push_back
              (plVar2,(value_type *)local_38);
    cur_level._M_current._4_4_ = 1;
  }
  else {
    plVar2 = __gnu_cxx::
             __normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
             ::operator->((__normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
                           *)&writeFileName);
    sVar3 = std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>::size(plVar2);
    if (sVar3 == (long)this->LEVEL0_LIMIT) {
      local_c0 = (list<DiskTableNode,_std::allocator<DiskTableNode>_> *)
                 std::
                 vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
                 ::begin(&this->diskView);
      local_b0._M_current = local_c0;
      local_b8 = std::
                 next<__gnu_cxx::__normal_iterator<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>*,std::vector<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>,std::allocator<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>>>>>
                           ((__normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
                             )local_c0,1);
      local_c8._M_current =
           (list<DiskTableNode,_std::allocator<DiskTableNode>_> *)
           std::
           vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
           ::end(&this->diskView);
      bVar1 = __gnu_cxx::operator==(&local_b8,&local_c8);
      if (bVar1) {
        compaction_into_level._M_current =
             (list<DiskTableNode,_std::allocator<DiskTableNode>_> *)0x0;
        std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>::list
                  ((list<DiskTableNode,_std::allocator<DiskTableNode>_> *)&compaction_into_level);
        std::
        vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
        ::push_back(&this->diskView,
                    (list<DiskTableNode,_std::allocator<DiskTableNode>_> *)&compaction_into_level);
        std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>::~list
                  ((list<DiskTableNode,_std::allocator<DiskTableNode>_> *)&compaction_into_level);
      }
      local_f0 = std::
                 next<__gnu_cxx::__normal_iterator<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>*,std::vector<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>,std::allocator<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>>>>>
                           (local_b0,1);
      overflow_data.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = this->LEVEL0_LIMIT * this->LEVEL_FACTOR;
      memset(&to_remove_file.
              super__List_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
              ._M_impl._M_node._M_size,0,0x18);
      std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector
                ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)
                 &to_remove_file.
                  super__List_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                  ._M_impl._M_node._M_size);
      memset(local_130,0,0x18);
      std::__cxx11::
      list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::list
                ((list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                  *)local_130);
      while( true ) {
        level0_0._M_node =
             (_List_node_base *)
             std::
             vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
             ::begin(&this->diskView);
        bVar1 = __gnu_cxx::operator==
                          (&local_b0,
                           (__normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
                            *)&level0_0);
        if (bVar1) {
          plVar2 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
                   ::operator->(&local_b0);
          local_150 = (_List_node_base *)
                      std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>::begin
                                (plVar2);
          level0_1._M_node = local_150;
          local_148 = std::next<std::_List_iterator<DiskTableNode>>
                                ((_List_iterator<DiskTableNode>)local_150,1);
          pSVar5 = DiskTableNode::getAllData((DiskTableNode *)local_38);
          pDVar4 = std::_List_iterator<DiskTableNode>::operator->(&local_148);
          datas_1 = DiskTableNode::getAllData(pDVar4);
          pDVar4 = std::_List_iterator<DiskTableNode>::operator->(&level0_1);
          datas_2 = DiskTableNode::getAllData(pDVar4);
          merge<std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*>
                    (&local_168,this,pSVar5,datas_1,datas_2);
          std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::operator=
                    ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)
                     &to_remove_file.
                      super__List_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                      ._M_impl._M_node._M_size,&local_168);
          std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector(&local_168);
          pDVar4 = std::_List_iterator<DiskTableNode>::operator->(&local_148);
          DiskTableNode::getFile_abi_cxx11_(&local_190,pDVar4);
          std::__cxx11::
          list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
          push_back((list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                     *)local_130,&local_190);
          std::filesystem::__cxx11::path::~path(&local_190);
          pDVar4 = std::_List_iterator<DiskTableNode>::operator->(&level0_1);
          DiskTableNode::getFile_abi_cxx11_((path *)&to_compaction_node,pDVar4);
          std::__cxx11::
          list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
          push_back((list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                     *)local_130,(value_type *)&to_compaction_node);
          std::filesystem::__cxx11::path::~path((path *)&to_compaction_node);
          plVar2 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
                   ::operator->((__normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
                                 *)&writeFileName);
          std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>::clear(plVar2);
        }
        plVar2 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
                 ::operator->(&local_f0);
        local_1c0._M_node =
             (_List_node_base *)
             std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>::begin(plVar2);
        while( true ) {
          plVar2 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
                   ::operator->(&local_f0);
          local_1c8._M_node =
               (_List_node_base *)
               std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>::end(plVar2);
          bVar1 = std::operator!=(&local_1c0,&local_1c8);
          if (!bVar1) break;
          pDVar4 = std::_List_iterator<DiskTableNode>::operator->(&local_1c0);
          bVar1 = DiskTableNode::intersect
                            (pDVar4,(SSTableData *)
                                    &to_remove_file.
                                     super__List_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                                     ._M_impl._M_node._M_size);
          if (bVar1) {
            pDVar4 = std::_List_iterator<DiskTableNode>::operator->(&local_1c0);
            pSVar5 = DiskTableNode::getAllData(pDVar4);
            merge<std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*>
                      (&local_1e0,this,
                       (vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)
                       &to_remove_file.
                        super__List_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                        ._M_impl._M_node._M_size,pSVar5);
            std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::operator=
                      ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)
                       &to_remove_file.
                        super__List_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                        ._M_impl._M_node._M_size,&local_1e0);
            std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector(&local_1e0);
            pDVar4 = std::_List_iterator<DiskTableNode>::operator->(&local_1c0);
            DiskTableNode::clearDataCache(pDVar4);
            pDVar4 = std::_List_iterator<DiskTableNode>::operator->(&local_1c0);
            DiskTableNode::getFile_abi_cxx11_(&local_208,pDVar4);
            std::__cxx11::
            list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
            push_back((list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                       *)local_130,&local_208);
            std::filesystem::__cxx11::path::~path(&local_208);
            plVar2 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
                     ::operator->(&local_f0);
            std::_List_const_iterator<DiskTableNode>::_List_const_iterator(&local_218,&local_1c0);
            local_210 = (_List_node_base *)
                        std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>::erase
                                  (plVar2,local_218);
            local_1c0._M_node = local_210;
          }
          else {
            std::_List_iterator<DiskTableNode>::operator++(&local_1c0,0);
          }
        }
        overflow_end = std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::begin
                                 ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)
                                  &to_remove_file.
                                   super__List_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                                   ._M_impl._M_node._M_size);
        persistent_data_block.
        super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::end
                                ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)
                                 &to_remove_file.
                                  super__List_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                                  ._M_impl._M_node._M_size);
        while( true ) {
          plVar2 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
                   ::operator->(&local_f0);
          sVar3 = std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>::size(plVar2);
          local_361 = false;
          if (sVar3 < (ulong)(long)overflow_data.
                                   super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
            local_361 = __gnu_cxx::operator!=
                                  (&overflow_end,
                                   (__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>
                                    *)&persistent_data_block.
                                       super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          if (local_361 == false) break;
          memset(&blocked_data_bytes,0,0x18);
          std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector
                    ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)
                     &blocked_data_bytes);
          local_250 = 0;
          while( true ) {
            local_362 = false;
            if (local_250 <= (ulong)(long)this->SSTABLE_SIZE_LIMIT) {
              local_362 = __gnu_cxx::operator!=
                                    (&overflow_end,
                                     (__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>
                                      *)&persistent_data_block.
                                         super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            if (local_362 == false) break;
            pSVar6 = __gnu_cxx::
                     __normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>
                     ::operator*(&overflow_end);
            sVar7 = size_of_entry(pSVar6);
            local_250 = local_250 + sVar7;
            pSVar6 = __gnu_cxx::
                     __normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>
                     ::operator*(&overflow_end);
            std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::push_back
                      ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)
                       &blocked_data_bytes,pSVar6);
            persistent_node.index =
                 (IndexMap *)
                 __gnu_cxx::
                 __normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>
                 ::operator++(&overflow_end,0);
          }
          DiskTableNode::DiskTableNode((DiskTableNode *)local_270);
          DiskTableNode::fillData((DiskTableNode *)local_270,(SSTableData *)&blocked_data_bytes);
          local_2a0 = local_f0._M_current;
          persistent::anon_class_8_1_8991fb9c::operator()
                    (&local_298,&local_70,(DiskViewLevelIter)local_f0._M_current);
          DiskTableNode::writeToDisk((DiskTableNode *)local_270,&local_298);
          std::filesystem::__cxx11::path::~path(&local_298);
          DiskTableNode::clearDataCache((DiskTableNode *)local_270);
          plVar2 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
                   ::operator->(&local_f0);
          std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>::push_back
                    (plVar2,(value_type *)local_270);
          DiskTableNode::~DiskTableNode((DiskTableNode *)local_270);
          std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector
                    ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)
                     &blocked_data_bytes);
        }
        bVar1 = __gnu_cxx::operator==
                          (&overflow_end,
                           (__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>
                            *)&persistent_data_block.
                               super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar1) break;
        local_2c8 = local_f0._M_current;
        local_2c0[0] = std::
                       next<__gnu_cxx::__normal_iterator<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>*,std::vector<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>,std::allocator<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>>>>>
                                 (local_f0,1);
        local_2d0._M_current =
             (list<DiskTableNode,_std::allocator<DiskTableNode>_> *)
             std::
             vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
             ::end(&this->diskView);
        bVar1 = __gnu_cxx::operator==(local_2c0,&local_2d0);
        if (bVar1) {
          local_2e8.super__List_base<DiskTableNode,_std::allocator<DiskTableNode>_>._M_impl._M_node.
          super__List_node_base._M_next = (_List_node_base *)0x0;
          local_2e8.super__List_base<DiskTableNode,_std::allocator<DiskTableNode>_>._M_impl._M_node.
          super__List_node_base._M_prev = (_List_node_base *)0x0;
          local_2e8.super__List_base<DiskTableNode,_std::allocator<DiskTableNode>_>._M_impl._M_node.
          _M_size = 0;
          std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>::list(&local_2e8);
          std::
          vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
          ::push_back(&this->diskView,&local_2e8);
          std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>::~list(&local_2e8);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
        ::operator++(&local_b0,0);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_*,_std::vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>_>
        ::operator++(&local_f0,0);
        overflow_data.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             this->LEVEL_FACTOR *
             overflow_data.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      }
      local_2a8 = (_List_node_base *)
                  std::__cxx11::
                  list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                  ::begin((list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                           *)local_130);
      local_2b0 = (_List_node_base *)
                  std::__cxx11::
                  list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                  ::end((list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                         *)local_130);
      std::
      for_each<std::_List_iterator<std::filesystem::__cxx11::path>,DiskTable::persistent(MemTable&&,bool)::__1>
                (local_2a8,local_2b0);
      std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::clear
                ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)
                 &to_remove_file.
                  super__List_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                  ._M_impl._M_node._M_size);
      std::__cxx11::
      list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::~list
                ((list<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                  *)local_130);
      std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector
                ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)
                 &to_remove_file.
                  super__List_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                  ._M_impl._M_node._M_size);
    }
    cur_level._M_current._4_4_ = 0;
  }
  DiskTableNode::~DiskTableNode((DiskTableNode *)local_38);
  return;
}

Assistant:

void DiskTable::persistent(MemTable &&m, bool df) {
    auto new_disk_node = DiskTableNode{};
    new_disk_node.fillData(m.collectData());
    auto level0 = diskView.begin();
    auto writeFileName = [this](DiskViewLevelIter level) {
        this->SSTableClock += 1;
        auto parent_dir = this->db_home / path{std::to_string(std::distance(this->diskView.begin(), level))};
        if (!exists(parent_dir)) {
            create_directory(parent_dir);
        }
        return parent_dir / (path{std::to_string(this->SSTableClock) + ".bin"});
    };
    if (level0->size() < LEVEL0_LIMIT) {
        new_disk_node.writeToDisk(writeFileName(level0));
        new_disk_node.clearDataCache();
        level0->push_back(std::move(new_disk_node));
        return;
    }
    if (level0->size() == LEVEL0_LIMIT) {
        auto cur_level = diskView.begin();
        if (std::next(cur_level) == diskView.end()) {
            diskView.push_back(DiskViewLevel{});
        }
        auto compaction_into_level = std::next(cur_level);
        auto compaction_into_level_limit = LEVEL0_LIMIT * LEVEL_FACTOR;
        auto overflow_data = SSTableData{};
        auto to_remove_file = std::list<path>{};
        while (true) {
            if (cur_level == diskView.begin()) {
                auto level0_0 = cur_level->begin();
                auto level0_1 = std::next(level0_0, 1);
                overflow_data = merge(new_disk_node.getAllData(), level0_1->getAllData(), level0_0->getAllData());
                to_remove_file.push_back(level0_1->getFile());
                to_remove_file.push_back(level0_0->getFile());
                level0->clear();
            }

            for (auto to_compaction_node = compaction_into_level->begin();
                 to_compaction_node != compaction_into_level->end();) {
                if (to_compaction_node->intersect(overflow_data)) {
                    overflow_data = merge(&overflow_data, to_compaction_node->getAllData());
                    to_compaction_node->clearDataCache();
                    to_remove_file.push_back(to_compaction_node->getFile());
                    to_compaction_node = compaction_into_level->erase(to_compaction_node);
                    continue;
                }
                to_compaction_node++;
            }

            auto cur_overflow_entry = overflow_data.begin();
            auto overflow_end = overflow_data.end();

            while (compaction_into_level->size() < compaction_into_level_limit && cur_overflow_entry != overflow_end) {
                auto persistent_data_block = SSTableData{};
                volatile size_t blocked_data_bytes = 0;
                while (blocked_data_bytes <= SSTABLE_SIZE_LIMIT && cur_overflow_entry != overflow_end) {
                    blocked_data_bytes += size_of_entry(*cur_overflow_entry);
                    persistent_data_block.push_back(*cur_overflow_entry);
                    cur_overflow_entry++;
                }
                auto persistent_node = DiskTableNode{};
                persistent_node.fillData(std::move(persistent_data_block));
                persistent_node.writeToDisk(writeFileName(compaction_into_level));
                persistent_node.clearDataCache();
                compaction_into_level->push_back(std::move(persistent_node));
            }

            if (cur_overflow_entry == overflow_end) {
                std::for_each(to_remove_file.begin(), to_remove_file.end(), [](path &file) { remove(file); });
                overflow_data.clear();
                break;
            }

            if (std::next(compaction_into_level) == diskView.end()) {
                diskView.push_back(DiskViewLevel{});
            }

            cur_level++;
            compaction_into_level++;
            compaction_into_level_limit *= LEVEL_FACTOR;
        }
    }
}